

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBorderClampTests.cpp
# Opt level: O0

int __thiscall glcts::TextureBorderClampTests::init(TextureBorderClampTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  TextureBorderClampParameterBorderColorErrorTest *this_00;
  TextureBorderClampTexParameterIErrorsTest *this_01;
  TextureBorderClampGetTexParameterIErrorsTest *this_02;
  TextureBorderClampSamplerParameterIErrorTest *this_03;
  TextureBorderClampSamplerParameterIWithWrongPnameTest *this_04;
  TextureBorderClampParameterTextureBorderColor *this_05;
  TextureBorderClampSamplingTexture<float,_unsigned_char> *pTVar1;
  TextureBorderClampSamplingTexture<int,_int> *pTVar2;
  TextureBorderClampSamplingTexture<unsigned_int,_unsigned_int> *pTVar3;
  TextureBorderClampSamplingTexture<unsigned_char,_unsigned_char> *pTVar4;
  TextureBorderClampSamplingTexture<unsigned_short,_unsigned_char> *pTVar5;
  undefined1 local_770 [8];
  TestConfiguration<unsigned_char,_unsigned_char> configurationTexture3DRGBA8Linear;
  TestConfiguration<float,_unsigned_char> configurationTexture3DRGBA32FLinear;
  TestConfiguration<float,_unsigned_char> configurationTexture2DArrayCompressedLinear;
  TestConfiguration<unsigned_char,_unsigned_char> configurationTexture2DArrayRGBA8Linear;
  TestConfiguration<float,_unsigned_char> configurationTexture2DArrayRGBA32FLinear;
  TestConfiguration<float,_unsigned_char> configurationTexture2DCompressedLinear;
  TestConfiguration<unsigned_short,_unsigned_char> configurationTexture2DDC16Linear;
  TestConfiguration<float,_unsigned_char> configurationTexture2DDC32FLinear;
  TestConfiguration<unsigned_char,_unsigned_char> configurationTexture2DRGBA8Linear;
  TestConfiguration<float,_unsigned_char> configurationTexture2DRGBA32FLinear;
  TestConfiguration<unsigned_char,_unsigned_char> configurationTexture3DRGBA8;
  TestConfiguration<unsigned_int,_unsigned_int> configurationTexture3DR32UI;
  TestConfiguration<int,_int> configurationTexture3DR32I;
  TestConfiguration<float,_unsigned_char> configurationTexture3DRGBA32F;
  TestConfiguration<float,_unsigned_char> configurationTexture2DArrayCompressed;
  TestConfiguration<unsigned_char,_unsigned_char> configurationTexture2DArrayRGBA8;
  TestConfiguration<unsigned_int,_unsigned_int> configurationTexture2DArrayR32UI;
  TestConfiguration<int,_int> configurationTexture2DArrayR32I;
  TestConfiguration<float,_unsigned_char> configurationTexture2DArrayRGBA32F;
  TestConfiguration<float,_unsigned_char> configurationTexture2DCompressed;
  TestConfiguration<unsigned_short,_unsigned_char> configurationTexture2DDC16;
  TestConfiguration<float,_unsigned_char> configurationTexture2DDC32F;
  TestConfiguration<unsigned_char,_unsigned_char> configurationTexture2DRGBA8;
  TestConfiguration<unsigned_int,_unsigned_int> configurationTexture2DR32UI;
  TestConfiguration<int,_int> configurationTexture2DR32I;
  TestConfiguration<float,_unsigned_char> configurationTexture2DRGBA32F;
  TextureBorderClampTests *this_local;
  
  tcu::TestNode::init((TestNode *)this,ctx);
  this_00 = (TextureBorderClampParameterBorderColorErrorTest *)operator_new(0x2f0);
  TextureBorderClampParameterBorderColorErrorTest::TextureBorderClampParameterBorderColorErrorTest
            (this_00,(this->super_TestCaseGroupBase).m_context,
             &(this->super_TestCaseGroupBase).m_extParams,"border_color_errors","Test 1");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
  this_01 = (TextureBorderClampTexParameterIErrorsTest *)operator_new(0x2f0);
  TextureBorderClampTexParameterIErrorsTest::TextureBorderClampTexParameterIErrorsTest
            (this_01,(this->super_TestCaseGroupBase).m_context,
             &(this->super_TestCaseGroupBase).m_extParams,"texparameteri_errors","Test 2");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_01);
  this_02 = (TextureBorderClampGetTexParameterIErrorsTest *)operator_new(0x308);
  TextureBorderClampGetTexParameterIErrorsTest::TextureBorderClampGetTexParameterIErrorsTest
            (this_02,(this->super_TestCaseGroupBase).m_context,
             &(this->super_TestCaseGroupBase).m_extParams,"gettexparameteri_errors","Test 3");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_02);
  this_03 = (TextureBorderClampSamplerParameterIErrorTest *)operator_new(0x308);
  TextureBorderClampSamplerParameterIErrorTest::TextureBorderClampSamplerParameterIErrorTest
            (this_03,(this->super_TestCaseGroupBase).m_context,
             &(this->super_TestCaseGroupBase).m_extParams,"samplerparameteri_non_gen_sampler_error",
             "Test 4");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_03);
  this_04 = (TextureBorderClampSamplerParameterIWithWrongPnameTest *)operator_new(0x308);
  TextureBorderClampSamplerParameterIWithWrongPnameTest::
  TextureBorderClampSamplerParameterIWithWrongPnameTest
            (this_04,(this->super_TestCaseGroupBase).m_context,
             &(this->super_TestCaseGroupBase).m_extParams,"samplerparameteri_with_wrong_pname",
             "Test 5");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_04);
  this_05 = (TextureBorderClampParameterTextureBorderColor *)operator_new(0x310);
  TextureBorderClampParameterTextureBorderColor::TextureBorderClampParameterTextureBorderColor
            (this_05,(this->super_TestCaseGroupBase).m_context,
             &(this->super_TestCaseGroupBase).m_extParams,"samplerparameteri_border_color","Test 6")
  ;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_05);
  TestConfiguration<float,_unsigned_char>::TestConfiguration
            ((TestConfiguration<float,_unsigned_char> *)&configurationTexture2DR32I.m_output_type,4,
             4,0xde1,0x8814,0x8058,0x2600,0x1908,0x1908,0x100,0x100,1,0.0,1.0,'\0',0xff,0x1406,
             0x1401);
  pTVar1 = (TextureBorderClampSamplingTexture<float,_unsigned_char> *)operator_new(0x328);
  TextureBorderClampSamplingTexture<float,_unsigned_char>::TextureBorderClampSamplingTexture
            (pTVar1,(this->super_TestCaseGroupBase).m_context,
             &(this->super_TestCaseGroupBase).m_extParams,"Texture2DRGBA32F","Test 7",
             (TestConfiguration<float,_unsigned_char> *)&configurationTexture2DR32I.m_output_type);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  TestConfiguration<int,_int>::TestConfiguration
            ((TestConfiguration<int,_int> *)&configurationTexture2DR32UI.m_output_type,1,4,0xde1,
             0x8235,0x8235,0x2600,0x8d94,0x8d99,0x100,0x100,1,0,0xff,0,0xff,0x1404,0x1404);
  pTVar2 = (TextureBorderClampSamplingTexture<int,_int> *)operator_new(0x330);
  TextureBorderClampSamplingTexture<int,_int>::TextureBorderClampSamplingTexture
            (pTVar2,(this->super_TestCaseGroupBase).m_context,
             &(this->super_TestCaseGroupBase).m_extParams,"Texture2DR32I","Test 7",
             (TestConfiguration<int,_int> *)&configurationTexture2DR32UI.m_output_type);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  TestConfiguration<unsigned_int,_unsigned_int>::TestConfiguration
            ((TestConfiguration<unsigned_int,_unsigned_int> *)
             &configurationTexture2DRGBA8.m_input_type,1,4,0xde1,0x8236,0x8236,0x2600,0x8d94,0x8d99,
             0x100,0x100,1,0,0xff,0,0xff,0x1405,0x1405);
  pTVar3 = (TextureBorderClampSamplingTexture<unsigned_int,_unsigned_int> *)operator_new(0x330);
  TextureBorderClampSamplingTexture<unsigned_int,_unsigned_int>::TextureBorderClampSamplingTexture
            (pTVar3,(this->super_TestCaseGroupBase).m_context,
             &(this->super_TestCaseGroupBase).m_extParams,"Texture2DR32UI","Test 7",
             (TestConfiguration<unsigned_int,_unsigned_int> *)
             &configurationTexture2DRGBA8.m_input_type);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar3);
  TestConfiguration<unsigned_char,_unsigned_char>::TestConfiguration
            ((TestConfiguration<unsigned_char,_unsigned_char> *)
             &configurationTexture2DDC32F.m_input_type,4,4,0xde1,0x8058,0x8058,0x2600,0x1908,0x1908,
             0x100,0x100,1,'\0',0xff,'\0',0xff,0x1401,0x1401);
  pTVar4 = (TextureBorderClampSamplingTexture<unsigned_char,_unsigned_char> *)operator_new(800);
  TextureBorderClampSamplingTexture<unsigned_char,_unsigned_char>::TextureBorderClampSamplingTexture
            (pTVar4,(this->super_TestCaseGroupBase).m_context,
             &(this->super_TestCaseGroupBase).m_extParams,"Texture2DRGBA8","Test 7",
             (TestConfiguration<unsigned_char,_unsigned_char> *)
             &configurationTexture2DDC32F.m_input_type);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar4);
  TestConfiguration<float,_unsigned_char>::TestConfiguration
            ((TestConfiguration<float,_unsigned_char> *)&configurationTexture2DDC16.m_output_type,1,
             1,0xde1,0x8cac,0x8229,0x2600,0x1902,0x1903,0x100,0x100,1,0.0,255.0,'\0',0xff,0x1406,
             0x1401);
  pTVar1 = (TextureBorderClampSamplingTexture<float,_unsigned_char> *)operator_new(0x328);
  TextureBorderClampSamplingTexture<float,_unsigned_char>::TextureBorderClampSamplingTexture
            (pTVar1,(this->super_TestCaseGroupBase).m_context,
             &(this->super_TestCaseGroupBase).m_extParams,"Texture2DDC32F","Test 7",
             (TestConfiguration<float,_unsigned_char> *)&configurationTexture2DDC16.m_output_type);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  TestConfiguration<unsigned_short,_unsigned_char>::TestConfiguration
            ((TestConfiguration<unsigned_short,_unsigned_char> *)
             &configurationTexture2DCompressed.m_input_type,1,1,0xde1,0x81a5,0x8229,0x2600,0x1902,
             0x1903,0x100,0x100,1,0,0xff,'\0',0xff,0x1403,0x1401);
  pTVar5 = (TextureBorderClampSamplingTexture<unsigned_short,_unsigned_char> *)operator_new(0x328);
  TextureBorderClampSamplingTexture<unsigned_short,_unsigned_char>::
  TextureBorderClampSamplingTexture
            (pTVar5,(this->super_TestCaseGroupBase).m_context,
             &(this->super_TestCaseGroupBase).m_extParams,"Texture2DDC16","Test 7",
             (TestConfiguration<unsigned_short,_unsigned_char> *)
             &configurationTexture2DCompressed.m_input_type);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar5);
  TestConfiguration<float,_unsigned_char>::TestConfiguration
            ((TestConfiguration<float,_unsigned_char> *)
             &configurationTexture2DArrayRGBA32F.m_input_type,4,4,0xde1,0x9278,0x8058,0x2600,0x1908,
             0x1908,0x40,0x40,1,0.0,1.0,'\0',0xff,0x1406,0x1401);
  pTVar1 = (TextureBorderClampSamplingTexture<float,_unsigned_char> *)operator_new(0x328);
  TextureBorderClampSamplingTexture<float,_unsigned_char>::TextureBorderClampSamplingTexture
            (pTVar1,(this->super_TestCaseGroupBase).m_context,
             &(this->super_TestCaseGroupBase).m_extParams,"Texture2DCompressed","Test 7",
             (TestConfiguration<float,_unsigned_char> *)
             &configurationTexture2DArrayRGBA32F.m_input_type);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  TestConfiguration<float,_unsigned_char>::TestConfiguration
            ((TestConfiguration<float,_unsigned_char> *)
             &configurationTexture2DArrayR32I.m_output_type,4,4,0x8c1a,0x8814,0x8058,0x2600,0x1908,
             0x1908,0x100,0x100,6,0.0,1.0,'\0',0xff,0x1406,0x1401);
  pTVar1 = (TextureBorderClampSamplingTexture<float,_unsigned_char> *)operator_new(0x328);
  TextureBorderClampSamplingTexture<float,_unsigned_char>::TextureBorderClampSamplingTexture
            (pTVar1,(this->super_TestCaseGroupBase).m_context,
             &(this->super_TestCaseGroupBase).m_extParams,"Texture2DArrayRGBA32F","Test 7",
             (TestConfiguration<float,_unsigned_char> *)
             &configurationTexture2DArrayR32I.m_output_type);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  TestConfiguration<int,_int>::TestConfiguration
            ((TestConfiguration<int,_int> *)&configurationTexture2DArrayR32UI.m_output_type,1,4,
             0x8c1a,0x8235,0x8235,0x2600,0x8d94,0x8d99,0x100,0x100,6,0,0xff,0,0xff,0x1404,0x1404);
  pTVar2 = (TextureBorderClampSamplingTexture<int,_int> *)operator_new(0x330);
  TextureBorderClampSamplingTexture<int,_int>::TextureBorderClampSamplingTexture
            (pTVar2,(this->super_TestCaseGroupBase).m_context,
             &(this->super_TestCaseGroupBase).m_extParams,"Texture2DArrayR32I","Test 7",
             (TestConfiguration<int,_int> *)&configurationTexture2DArrayR32UI.m_output_type);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  TestConfiguration<unsigned_int,_unsigned_int>::TestConfiguration
            ((TestConfiguration<unsigned_int,_unsigned_int> *)
             &configurationTexture2DArrayRGBA8.m_input_type,1,4,0x8c1a,0x8236,0x8236,0x2600,0x8d94,
             0x8d99,0x100,0x100,6,0,0xff,0,0xff,0x1405,0x1405);
  pTVar3 = (TextureBorderClampSamplingTexture<unsigned_int,_unsigned_int> *)operator_new(0x330);
  TextureBorderClampSamplingTexture<unsigned_int,_unsigned_int>::TextureBorderClampSamplingTexture
            (pTVar3,(this->super_TestCaseGroupBase).m_context,
             &(this->super_TestCaseGroupBase).m_extParams,"Texture2DArrayR32UI","Test 7",
             (TestConfiguration<unsigned_int,_unsigned_int> *)
             &configurationTexture2DArrayRGBA8.m_input_type);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar3);
  TestConfiguration<unsigned_char,_unsigned_char>::TestConfiguration
            ((TestConfiguration<unsigned_char,_unsigned_char> *)
             &configurationTexture2DArrayCompressed.m_input_type,4,4,0x8c1a,0x8058,0x8058,0x2600,
             0x1908,0x1908,0x100,0x100,6,'\0',0xff,'\0',0xff,0x1401,0x1401);
  pTVar4 = (TextureBorderClampSamplingTexture<unsigned_char,_unsigned_char> *)operator_new(800);
  TextureBorderClampSamplingTexture<unsigned_char,_unsigned_char>::TextureBorderClampSamplingTexture
            (pTVar4,(this->super_TestCaseGroupBase).m_context,
             &(this->super_TestCaseGroupBase).m_extParams,"Texture2DArrayRGBA8","Test 7",
             (TestConfiguration<unsigned_char,_unsigned_char> *)
             &configurationTexture2DArrayCompressed.m_input_type);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar4);
  TestConfiguration<float,_unsigned_char>::TestConfiguration
            ((TestConfiguration<float,_unsigned_char> *)&configurationTexture3DRGBA32F.m_input_type,
             4,4,0x8c1a,0x9278,0x8058,0x2600,0x1908,0x1908,0x40,0x40,6,0.0,1.0,'\0',0xff,0x1406,
             0x1401);
  pTVar1 = (TextureBorderClampSamplingTexture<float,_unsigned_char> *)operator_new(0x328);
  TextureBorderClampSamplingTexture<float,_unsigned_char>::TextureBorderClampSamplingTexture
            (pTVar1,(this->super_TestCaseGroupBase).m_context,
             &(this->super_TestCaseGroupBase).m_extParams,"Texture2DArrayCompressed","Test 7",
             (TestConfiguration<float,_unsigned_char> *)&configurationTexture3DRGBA32F.m_input_type)
  ;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  TestConfiguration<float,_unsigned_char>::TestConfiguration
            ((TestConfiguration<float,_unsigned_char> *)&configurationTexture3DR32I.m_output_type,4,
             4,0x806f,0x8814,0x8058,0x2600,0x1908,0x1908,0x100,0x100,6,0.0,1.0,'\0',0xff,0x1406,
             0x1401);
  pTVar1 = (TextureBorderClampSamplingTexture<float,_unsigned_char> *)operator_new(0x328);
  TextureBorderClampSamplingTexture<float,_unsigned_char>::TextureBorderClampSamplingTexture
            (pTVar1,(this->super_TestCaseGroupBase).m_context,
             &(this->super_TestCaseGroupBase).m_extParams,"Texture3DRGBA32F","Test 7",
             (TestConfiguration<float,_unsigned_char> *)&configurationTexture3DR32I.m_output_type);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  TestConfiguration<int,_int>::TestConfiguration
            ((TestConfiguration<int,_int> *)&configurationTexture3DR32UI.m_output_type,1,4,0x806f,
             0x8235,0x8235,0x2600,0x8d94,0x8d99,0x100,0x100,6,0,0xff,0,0xff,0x1404,0x1404);
  pTVar2 = (TextureBorderClampSamplingTexture<int,_int> *)operator_new(0x330);
  TextureBorderClampSamplingTexture<int,_int>::TextureBorderClampSamplingTexture
            (pTVar2,(this->super_TestCaseGroupBase).m_context,
             &(this->super_TestCaseGroupBase).m_extParams,"Texture3DR32I","Test 7",
             (TestConfiguration<int,_int> *)&configurationTexture3DR32UI.m_output_type);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  TestConfiguration<unsigned_int,_unsigned_int>::TestConfiguration
            ((TestConfiguration<unsigned_int,_unsigned_int> *)
             &configurationTexture3DRGBA8.m_input_type,1,4,0x806f,0x8236,0x8236,0x2600,0x8d94,0x8d99
             ,0x100,0x100,6,0,0xff,0,0xff,0x1405,0x1405);
  pTVar3 = (TextureBorderClampSamplingTexture<unsigned_int,_unsigned_int> *)operator_new(0x330);
  TextureBorderClampSamplingTexture<unsigned_int,_unsigned_int>::TextureBorderClampSamplingTexture
            (pTVar3,(this->super_TestCaseGroupBase).m_context,
             &(this->super_TestCaseGroupBase).m_extParams,"Texture3DR32UI","Test 7",
             (TestConfiguration<unsigned_int,_unsigned_int> *)
             &configurationTexture3DRGBA8.m_input_type);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar3);
  TestConfiguration<unsigned_char,_unsigned_char>::TestConfiguration
            ((TestConfiguration<unsigned_char,_unsigned_char> *)
             &configurationTexture2DRGBA32FLinear.m_input_type,4,4,0x806f,0x8058,0x8058,0x2600,
             0x1908,0x1908,0x100,0x100,6,'\0',0xff,'\0',0xff,0x1401,0x1401);
  pTVar4 = (TextureBorderClampSamplingTexture<unsigned_char,_unsigned_char> *)operator_new(800);
  TextureBorderClampSamplingTexture<unsigned_char,_unsigned_char>::TextureBorderClampSamplingTexture
            (pTVar4,(this->super_TestCaseGroupBase).m_context,
             &(this->super_TestCaseGroupBase).m_extParams,"Texture3DRGBA8","Test 7",
             (TestConfiguration<unsigned_char,_unsigned_char> *)
             &configurationTexture2DRGBA32FLinear.m_input_type);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar4);
  TestConfiguration<float,_unsigned_char>::TestConfiguration
            ((TestConfiguration<float,_unsigned_char> *)
             &configurationTexture2DRGBA8Linear.m_input_type,4,4,0xde1,0x8814,0x8058,0x2601,0x1908,
             0x1908,0x100,0x100,1,0.0,1.0,'\0',0xff,0x1406,0x1401);
  pTVar1 = (TextureBorderClampSamplingTexture<float,_unsigned_char> *)operator_new(0x328);
  TextureBorderClampSamplingTexture<float,_unsigned_char>::TextureBorderClampSamplingTexture
            (pTVar1,(this->super_TestCaseGroupBase).m_context,
             &(this->super_TestCaseGroupBase).m_extParams,"Texture2DRGBA32FLinear","Test 7",
             (TestConfiguration<float,_unsigned_char> *)
             &configurationTexture2DRGBA8Linear.m_input_type);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  TestConfiguration<unsigned_char,_unsigned_char>::TestConfiguration
            ((TestConfiguration<unsigned_char,_unsigned_char> *)
             &configurationTexture2DDC32FLinear.m_input_type,4,4,0xde1,0x8058,0x8058,0x2601,0x1908,
             0x1908,0x100,0x100,1,'\0',0xff,'\0',0xff,0x1401,0x1401);
  pTVar4 = (TextureBorderClampSamplingTexture<unsigned_char,_unsigned_char> *)operator_new(800);
  TextureBorderClampSamplingTexture<unsigned_char,_unsigned_char>::TextureBorderClampSamplingTexture
            (pTVar4,(this->super_TestCaseGroupBase).m_context,
             &(this->super_TestCaseGroupBase).m_extParams,"Texture2DRGBA8Linear","Test 7",
             (TestConfiguration<unsigned_char,_unsigned_char> *)
             &configurationTexture2DDC32FLinear.m_input_type);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar4);
  TestConfiguration<float,_unsigned_char>::TestConfiguration
            ((TestConfiguration<float,_unsigned_char> *)
             &configurationTexture2DDC16Linear.m_output_type,1,1,0xde1,0x8cac,0x8229,0x2601,0x1902,
             0x1903,0x100,0x100,1,0.0,255.0,'\0',0xff,0x1406,0x1401);
  pTVar1 = (TextureBorderClampSamplingTexture<float,_unsigned_char> *)operator_new(0x328);
  TextureBorderClampSamplingTexture<float,_unsigned_char>::TextureBorderClampSamplingTexture
            (pTVar1,(this->super_TestCaseGroupBase).m_context,
             &(this->super_TestCaseGroupBase).m_extParams,"Texture2DDC32FLinear","Test 7",
             (TestConfiguration<float,_unsigned_char> *)
             &configurationTexture2DDC16Linear.m_output_type);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  TestConfiguration<unsigned_short,_unsigned_char>::TestConfiguration
            ((TestConfiguration<unsigned_short,_unsigned_char> *)
             &configurationTexture2DCompressedLinear.m_input_type,1,1,0xde1,0x81a5,0x8229,0x2601,
             0x1902,0x1903,0x100,0x100,1,0,0xff,'\0',0xff,0x1403,0x1401);
  pTVar5 = (TextureBorderClampSamplingTexture<unsigned_short,_unsigned_char> *)operator_new(0x328);
  TextureBorderClampSamplingTexture<unsigned_short,_unsigned_char>::
  TextureBorderClampSamplingTexture
            (pTVar5,(this->super_TestCaseGroupBase).m_context,
             &(this->super_TestCaseGroupBase).m_extParams,"Texture2DDC16Linear","Test 7",
             (TestConfiguration<unsigned_short,_unsigned_char> *)
             &configurationTexture2DCompressedLinear.m_input_type);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar5);
  TestConfiguration<float,_unsigned_char>::TestConfiguration
            ((TestConfiguration<float,_unsigned_char> *)
             &configurationTexture2DArrayRGBA32FLinear.m_input_type,4,4,0xde1,0x9278,0x8058,0x2601,
             0x1908,0x1908,0x40,0x40,1,0.0,1.0,'\0',0xff,0x1406,0x1401);
  pTVar1 = (TextureBorderClampSamplingTexture<float,_unsigned_char> *)operator_new(0x328);
  TextureBorderClampSamplingTexture<float,_unsigned_char>::TextureBorderClampSamplingTexture
            (pTVar1,(this->super_TestCaseGroupBase).m_context,
             &(this->super_TestCaseGroupBase).m_extParams,"Texture2DCompressedLinear","Test 7",
             (TestConfiguration<float,_unsigned_char> *)
             &configurationTexture2DArrayRGBA32FLinear.m_input_type);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  TestConfiguration<float,_unsigned_char>::TestConfiguration
            ((TestConfiguration<float,_unsigned_char> *)
             &configurationTexture2DArrayRGBA8Linear.m_input_type,4,4,0x8c1a,0x8814,0x8058,0x2601,
             0x1908,0x1908,0x100,0x100,6,0.0,1.0,'\0',0xff,0x1406,0x1401);
  pTVar1 = (TextureBorderClampSamplingTexture<float,_unsigned_char> *)operator_new(0x328);
  TextureBorderClampSamplingTexture<float,_unsigned_char>::TextureBorderClampSamplingTexture
            (pTVar1,(this->super_TestCaseGroupBase).m_context,
             &(this->super_TestCaseGroupBase).m_extParams,"Texture2DArrayRGBA32FLinear","Test 7",
             (TestConfiguration<float,_unsigned_char> *)
             &configurationTexture2DArrayRGBA8Linear.m_input_type);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  TestConfiguration<unsigned_char,_unsigned_char>::TestConfiguration
            ((TestConfiguration<unsigned_char,_unsigned_char> *)
             &configurationTexture2DArrayCompressedLinear.m_input_type,4,4,0x8c1a,0x8058,0x8058,
             0x2601,0x1908,0x1908,0x100,0x100,6,'\0',0xff,'\0',0xff,0x1401,0x1401);
  pTVar4 = (TextureBorderClampSamplingTexture<unsigned_char,_unsigned_char> *)operator_new(800);
  TextureBorderClampSamplingTexture<unsigned_char,_unsigned_char>::TextureBorderClampSamplingTexture
            (pTVar4,(this->super_TestCaseGroupBase).m_context,
             &(this->super_TestCaseGroupBase).m_extParams,"Texture2DArrayRGBA8Linear","Test 7",
             (TestConfiguration<unsigned_char,_unsigned_char> *)
             &configurationTexture2DArrayCompressedLinear.m_input_type);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar4);
  TestConfiguration<float,_unsigned_char>::TestConfiguration
            ((TestConfiguration<float,_unsigned_char> *)
             &configurationTexture3DRGBA32FLinear.m_input_type,4,4,0x8c1a,0x9278,0x8058,0x2601,
             0x1908,0x1908,0x40,0x40,6,0.0,1.0,'\0',0xff,0x1406,0x1401);
  pTVar1 = (TextureBorderClampSamplingTexture<float,_unsigned_char> *)operator_new(0x328);
  TextureBorderClampSamplingTexture<float,_unsigned_char>::TextureBorderClampSamplingTexture
            (pTVar1,(this->super_TestCaseGroupBase).m_context,
             &(this->super_TestCaseGroupBase).m_extParams,"Texture2DArrayCompressedLinear","Test 7",
             (TestConfiguration<float,_unsigned_char> *)
             &configurationTexture3DRGBA32FLinear.m_input_type);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  TestConfiguration<float,_unsigned_char>::TestConfiguration
            ((TestConfiguration<float,_unsigned_char> *)
             &configurationTexture3DRGBA8Linear.m_input_type,4,4,0x806f,0x8814,0x8058,0x2601,0x1908,
             0x1908,0x100,0x100,6,0.0,1.0,'\0',0xff,0x1406,0x1401);
  pTVar1 = (TextureBorderClampSamplingTexture<float,_unsigned_char> *)operator_new(0x328);
  TextureBorderClampSamplingTexture<float,_unsigned_char>::TextureBorderClampSamplingTexture
            (pTVar1,(this->super_TestCaseGroupBase).m_context,
             &(this->super_TestCaseGroupBase).m_extParams,"Texture3DRGBA32FLinear","Test 7",
             (TestConfiguration<float,_unsigned_char> *)
             &configurationTexture3DRGBA8Linear.m_input_type);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  TestConfiguration<unsigned_char,_unsigned_char>::TestConfiguration
            ((TestConfiguration<unsigned_char,_unsigned_char> *)local_770,4,4,0x806f,0x8058,0x8058,
             0x2601,0x1908,0x1908,0x100,0x100,6,'\0',0xff,'\0',0xff,0x1401,0x1401);
  pTVar4 = (TextureBorderClampSamplingTexture<unsigned_char,_unsigned_char> *)operator_new(800);
  TextureBorderClampSamplingTexture<unsigned_char,_unsigned_char>::TextureBorderClampSamplingTexture
            (pTVar4,(this->super_TestCaseGroupBase).m_context,
             &(this->super_TestCaseGroupBase).m_extParams,"Texture3DRGBA8Linear","Test 7",
             (TestConfiguration<unsigned_char,_unsigned_char> *)local_770);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar4);
  TestConfiguration<unsigned_char,_unsigned_char>::~TestConfiguration
            ((TestConfiguration<unsigned_char,_unsigned_char> *)local_770);
  TestConfiguration<float,_unsigned_char>::~TestConfiguration
            ((TestConfiguration<float,_unsigned_char> *)
             &configurationTexture3DRGBA8Linear.m_input_type);
  TestConfiguration<float,_unsigned_char>::~TestConfiguration
            ((TestConfiguration<float,_unsigned_char> *)
             &configurationTexture3DRGBA32FLinear.m_input_type);
  TestConfiguration<unsigned_char,_unsigned_char>::~TestConfiguration
            ((TestConfiguration<unsigned_char,_unsigned_char> *)
             &configurationTexture2DArrayCompressedLinear.m_input_type);
  TestConfiguration<float,_unsigned_char>::~TestConfiguration
            ((TestConfiguration<float,_unsigned_char> *)
             &configurationTexture2DArrayRGBA8Linear.m_input_type);
  TestConfiguration<float,_unsigned_char>::~TestConfiguration
            ((TestConfiguration<float,_unsigned_char> *)
             &configurationTexture2DArrayRGBA32FLinear.m_input_type);
  TestConfiguration<unsigned_short,_unsigned_char>::~TestConfiguration
            ((TestConfiguration<unsigned_short,_unsigned_char> *)
             &configurationTexture2DCompressedLinear.m_input_type);
  TestConfiguration<float,_unsigned_char>::~TestConfiguration
            ((TestConfiguration<float,_unsigned_char> *)
             &configurationTexture2DDC16Linear.m_output_type);
  TestConfiguration<unsigned_char,_unsigned_char>::~TestConfiguration
            ((TestConfiguration<unsigned_char,_unsigned_char> *)
             &configurationTexture2DDC32FLinear.m_input_type);
  TestConfiguration<float,_unsigned_char>::~TestConfiguration
            ((TestConfiguration<float,_unsigned_char> *)
             &configurationTexture2DRGBA8Linear.m_input_type);
  TestConfiguration<unsigned_char,_unsigned_char>::~TestConfiguration
            ((TestConfiguration<unsigned_char,_unsigned_char> *)
             &configurationTexture2DRGBA32FLinear.m_input_type);
  TestConfiguration<unsigned_int,_unsigned_int>::~TestConfiguration
            ((TestConfiguration<unsigned_int,_unsigned_int> *)
             &configurationTexture3DRGBA8.m_input_type);
  TestConfiguration<int,_int>::~TestConfiguration
            ((TestConfiguration<int,_int> *)&configurationTexture3DR32UI.m_output_type);
  TestConfiguration<float,_unsigned_char>::~TestConfiguration
            ((TestConfiguration<float,_unsigned_char> *)&configurationTexture3DR32I.m_output_type);
  TestConfiguration<float,_unsigned_char>::~TestConfiguration
            ((TestConfiguration<float,_unsigned_char> *)&configurationTexture3DRGBA32F.m_input_type)
  ;
  TestConfiguration<unsigned_char,_unsigned_char>::~TestConfiguration
            ((TestConfiguration<unsigned_char,_unsigned_char> *)
             &configurationTexture2DArrayCompressed.m_input_type);
  TestConfiguration<unsigned_int,_unsigned_int>::~TestConfiguration
            ((TestConfiguration<unsigned_int,_unsigned_int> *)
             &configurationTexture2DArrayRGBA8.m_input_type);
  TestConfiguration<int,_int>::~TestConfiguration
            ((TestConfiguration<int,_int> *)&configurationTexture2DArrayR32UI.m_output_type);
  TestConfiguration<float,_unsigned_char>::~TestConfiguration
            ((TestConfiguration<float,_unsigned_char> *)
             &configurationTexture2DArrayR32I.m_output_type);
  TestConfiguration<float,_unsigned_char>::~TestConfiguration
            ((TestConfiguration<float,_unsigned_char> *)
             &configurationTexture2DArrayRGBA32F.m_input_type);
  TestConfiguration<unsigned_short,_unsigned_char>::~TestConfiguration
            ((TestConfiguration<unsigned_short,_unsigned_char> *)
             &configurationTexture2DCompressed.m_input_type);
  TestConfiguration<float,_unsigned_char>::~TestConfiguration
            ((TestConfiguration<float,_unsigned_char> *)&configurationTexture2DDC16.m_output_type);
  TestConfiguration<unsigned_char,_unsigned_char>::~TestConfiguration
            ((TestConfiguration<unsigned_char,_unsigned_char> *)
             &configurationTexture2DDC32F.m_input_type);
  TestConfiguration<unsigned_int,_unsigned_int>::~TestConfiguration
            ((TestConfiguration<unsigned_int,_unsigned_int> *)
             &configurationTexture2DRGBA8.m_input_type);
  TestConfiguration<int,_int>::~TestConfiguration
            ((TestConfiguration<int,_int> *)&configurationTexture2DR32UI.m_output_type);
  TestConfiguration<float,_unsigned_char>::~TestConfiguration
            ((TestConfiguration<float,_unsigned_char> *)&configurationTexture2DR32I.m_output_type);
  return extraout_EAX;
}

Assistant:

void TextureBorderClampTests::init(void)
{
	/* Initialize base class */
	TestCaseGroupBase::init();

	/* Texture Border Clamp Border Color Errors (Test 1) */
	addChild(
		new TextureBorderClampParameterBorderColorErrorTest(m_context, m_extParams, "border_color_errors", "Test 1"));

	/* Texture Border Clamp glTexParameterIivEXT(), glTexParameterIuivEXT() Errors (Test 2) */
	addChild(new TextureBorderClampTexParameterIErrorsTest(m_context, m_extParams, "texparameteri_errors", "Test 2"));

	/* Texture Border Clamp glGetTexParameterIivEXT(), glGetTexParameterIuivEXT() Errors (Test 3)*/
	addChild(
		new TextureBorderClampGetTexParameterIErrorsTest(m_context, m_extParams, "gettexparameteri_errors", "Test 3"));

	/* Texture Border Clamp glGetSamplerParameterI* and glSamplerParameterI* errors for non generate sampler (Test 4)*/
	addChild(new TextureBorderClampSamplerParameterIErrorTest(m_context, m_extParams,
															  "samplerparameteri_non_gen_sampler_error", "Test 4"));

	/* Texture Border Clamp glGetSamplerParameterI* and glSamplerParameterI* errors for non generate sampler (Test 5)*/
	addChild(new TextureBorderClampSamplerParameterIWithWrongPnameTest(m_context, m_extParams,
																	   "samplerparameteri_with_wrong_pname", "Test 5"));

	/* Texture Border Clamp glGetSamplerParameterI* and glSamplerParameterI* errors for non GL_TEXTURE_BORDER_COLOR_EXT (Test 6)*/
	addChild(new TextureBorderClampParameterTextureBorderColor(m_context, m_extParams, "samplerparameteri_border_color",
															   "Test 6"));

	/* Texture Border Clamp Sampling Texture (Test 7) */
	TestConfiguration<glw::GLfloat, glw::GLubyte> configurationTexture2DRGBA32F(
		4, 4, GL_TEXTURE_2D, GL_RGBA32F, GL_RGBA8, GL_NEAREST, GL_RGBA, GL_RGBA, 256, 256, 1, 0.0f, 1.0f, 0, 255,
		GL_FLOAT, GL_UNSIGNED_BYTE);

	addChild(new TextureBorderClampSamplingTexture<glw::GLfloat, glw::GLubyte>(
		m_context, m_extParams, "Texture2DRGBA32F", "Test 7", configurationTexture2DRGBA32F));

	/* GL_R32I */
	TestConfiguration<glw::GLint, glw::GLint> configurationTexture2DR32I(1, 4, GL_TEXTURE_2D, GL_R32I, GL_R32I,
																		 GL_NEAREST, GL_RED_INTEGER, GL_RGBA_INTEGER,
																		 256, 256, 1, 0, 255, 0, 255, GL_INT, GL_INT);

	addChild(new TextureBorderClampSamplingTexture<glw::GLint, glw::GLint>(m_context, m_extParams, "Texture2DR32I",
																		   "Test 7", configurationTexture2DR32I));

	/* GL_R32UI */
	TestConfiguration<glw::GLuint, glw::GLuint> configurationTexture2DR32UI(
		1, 4, GL_TEXTURE_2D, GL_R32UI, GL_R32UI, GL_NEAREST, GL_RED_INTEGER, GL_RGBA_INTEGER, 256, 256, 1, 0, 255, 0,
		255, GL_UNSIGNED_INT, GL_UNSIGNED_INT);

	addChild(new TextureBorderClampSamplingTexture<glw::GLuint, glw::GLuint>(m_context, m_extParams, "Texture2DR32UI",
																			 "Test 7", configurationTexture2DR32UI));

	/* GL_RGBA8 */
	TestConfiguration<glw::GLubyte, glw::GLubyte> configurationTexture2DRGBA8(
		4, 4, GL_TEXTURE_2D, GL_RGBA8, GL_RGBA8, GL_NEAREST, GL_RGBA, GL_RGBA, 256, 256, 1, 0, 255, 0, 255,
		GL_UNSIGNED_BYTE, GL_UNSIGNED_BYTE);

	addChild(new TextureBorderClampSamplingTexture<glw::GLubyte, glw::GLubyte>(m_context, m_extParams, "Texture2DRGBA8",
																			   "Test 7", configurationTexture2DRGBA8));

	/* GL_DEPTH_COMPONENT32F */
	TestConfiguration<glw::GLfloat, glw::GLubyte> configurationTexture2DDC32F(
		1, 1, GL_TEXTURE_2D, GL_DEPTH_COMPONENT32F, GL_R8, GL_NEAREST, GL_DEPTH_COMPONENT, GL_RED, 256, 256, 1, 0, 255,
		0, 255, GL_FLOAT, GL_UNSIGNED_BYTE);

	addChild(new TextureBorderClampSamplingTexture<glw::GLfloat, glw::GLubyte>(m_context, m_extParams, "Texture2DDC32F",
																			   "Test 7", configurationTexture2DDC32F));

	/* GL_DEPTH_COMPONENT16 */
	TestConfiguration<glw::GLushort, glw::GLubyte> configurationTexture2DDC16(
		1, 1, GL_TEXTURE_2D, GL_DEPTH_COMPONENT16, GL_R8, GL_NEAREST, GL_DEPTH_COMPONENT, GL_RED, 256, 256, 1, 0, 255,
		0, 255, GL_UNSIGNED_SHORT, GL_UNSIGNED_BYTE);

	addChild(new TextureBorderClampSamplingTexture<glw::GLushort, glw::GLubyte>(m_context, m_extParams, "Texture2DDC16",
																				"Test 7", configurationTexture2DDC16));

	/* GL_COMPRESSED_RGBA8_ETC2_EAC */
	TestConfiguration<glw::GLfloat, glw::GLubyte> configurationTexture2DCompressed(
		4, 4, GL_TEXTURE_2D, GL_COMPRESSED_RGBA8_ETC2_EAC, GL_RGBA8, GL_NEAREST, GL_RGBA, GL_RGBA, 64, 64, 1, 0, 1, 0,
		255, GL_FLOAT, GL_UNSIGNED_BYTE);

	addChild(new TextureBorderClampSamplingTexture<glw::GLfloat, glw::GLubyte>(
		m_context, m_extParams, "Texture2DCompressed", "Test 7", configurationTexture2DCompressed));

	/* Target GL_TEXTURE_2D_ARRAY */

	/* GL_RGBA32F */
	TestConfiguration<glw::GLfloat, glw::GLubyte> configurationTexture2DArrayRGBA32F(
		4, 4, GL_TEXTURE_2D_ARRAY, GL_RGBA32F, GL_RGBA8, GL_NEAREST, GL_RGBA, GL_RGBA, 256, 256, 6, 0.0f, 1.0f, 0, 255,
		GL_FLOAT, GL_UNSIGNED_BYTE);

	addChild(new TextureBorderClampSamplingTexture<glw::GLfloat, glw::GLubyte>(
		m_context, m_extParams, "Texture2DArrayRGBA32F", "Test 7", configurationTexture2DArrayRGBA32F));

	/* GL_R32I */
	TestConfiguration<glw::GLint, glw::GLint> configurationTexture2DArrayR32I(
		1, 4, GL_TEXTURE_2D_ARRAY, GL_R32I, GL_R32I, GL_NEAREST, GL_RED_INTEGER, GL_RGBA_INTEGER, 256, 256, 6, 0, 255,
		0, 255, GL_INT, GL_INT);

	addChild(new TextureBorderClampSamplingTexture<glw::GLint, glw::GLint>(m_context, m_extParams, "Texture2DArrayR32I",
																		   "Test 7", configurationTexture2DArrayR32I));

	/* GL_R32UI */
	TestConfiguration<glw::GLuint, glw::GLuint> configurationTexture2DArrayR32UI(
		1, 4, GL_TEXTURE_2D_ARRAY, GL_R32UI, GL_R32UI, GL_NEAREST, GL_RED_INTEGER, GL_RGBA_INTEGER, 256, 256, 6, 0, 255,
		0, 255, GL_UNSIGNED_INT, GL_UNSIGNED_INT);

	addChild(new TextureBorderClampSamplingTexture<glw::GLuint, glw::GLuint>(
		m_context, m_extParams, "Texture2DArrayR32UI", "Test 7", configurationTexture2DArrayR32UI));

	/* GL_RGBA8 */
	TestConfiguration<glw::GLubyte, glw::GLubyte> configurationTexture2DArrayRGBA8(
		4, 4, GL_TEXTURE_2D_ARRAY, GL_RGBA8, GL_RGBA8, GL_NEAREST, GL_RGBA, GL_RGBA, 256, 256, 6, 0, 255, 0, 255,
		GL_UNSIGNED_BYTE, GL_UNSIGNED_BYTE);

	addChild(new TextureBorderClampSamplingTexture<glw::GLubyte, glw::GLubyte>(
		m_context, m_extParams, "Texture2DArrayRGBA8", "Test 7", configurationTexture2DArrayRGBA8));

	/* GL_COMPRESSED_RGBA8_ETC2_EAC */
	TestConfiguration<glw::GLfloat, glw::GLubyte> configurationTexture2DArrayCompressed(
		4, 4, GL_TEXTURE_2D_ARRAY, GL_COMPRESSED_RGBA8_ETC2_EAC, GL_RGBA8, GL_NEAREST, GL_RGBA, GL_RGBA, 64, 64, 6, 0,
		1, 0, 255, GL_FLOAT, GL_UNSIGNED_BYTE);

	addChild(new TextureBorderClampSamplingTexture<glw::GLfloat, glw::GLubyte>(
		m_context, m_extParams, "Texture2DArrayCompressed", "Test 7", configurationTexture2DArrayCompressed));

	/* Target GL_TEXTURE_3D */

	/* GL_RGBA32F */
	TestConfiguration<glw::GLfloat, glw::GLubyte> configurationTexture3DRGBA32F(
		4, 4, GL_TEXTURE_3D, GL_RGBA32F, GL_RGBA8, GL_NEAREST, GL_RGBA, GL_RGBA, 256, 256, 6, 0.0f, 1.0f, 0, 255,
		GL_FLOAT, GL_UNSIGNED_BYTE);
	addChild(new TextureBorderClampSamplingTexture<glw::GLfloat, glw::GLubyte>(
		m_context, m_extParams, "Texture3DRGBA32F", "Test 7", configurationTexture3DRGBA32F));

	/* GL_R32I */
	TestConfiguration<glw::GLint, glw::GLint> configurationTexture3DR32I(1, 4, GL_TEXTURE_3D, GL_R32I, GL_R32I,
																		 GL_NEAREST, GL_RED_INTEGER, GL_RGBA_INTEGER,
																		 256, 256, 6, 0, 255, 0, 255, GL_INT, GL_INT);

	addChild(new TextureBorderClampSamplingTexture<glw::GLint, glw::GLint>(m_context, m_extParams, "Texture3DR32I",
																		   "Test 7", configurationTexture3DR32I));

	/* GL_R32UI */
	TestConfiguration<glw::GLuint, glw::GLuint> configurationTexture3DR32UI(
		1, 4, GL_TEXTURE_3D, GL_R32UI, GL_R32UI, GL_NEAREST, GL_RED_INTEGER, GL_RGBA_INTEGER, 256, 256, 6, 0, 255, 0,
		255, GL_UNSIGNED_INT, GL_UNSIGNED_INT);

	addChild(new TextureBorderClampSamplingTexture<glw::GLuint, glw::GLuint>(m_context, m_extParams, "Texture3DR32UI",
																			 "Test 7", configurationTexture3DR32UI));

	/* GL_RGBA8 */
	TestConfiguration<glw::GLubyte, glw::GLubyte> configurationTexture3DRGBA8(
		4, 4, GL_TEXTURE_3D, GL_RGBA8, GL_RGBA8, GL_NEAREST, GL_RGBA, GL_RGBA, 256, 256, 6, 0, 255, 0, 255,
		GL_UNSIGNED_BYTE, GL_UNSIGNED_BYTE);

	addChild(new TextureBorderClampSamplingTexture<glw::GLubyte, glw::GLubyte>(m_context, m_extParams, "Texture3DRGBA8",
																			   "Test 7", configurationTexture3DRGBA8));

	/* Filtering GL_LINEAR */

	/* Target GL_TEXTURE_2D */

	/* GL_RGBA32F */
	TestConfiguration<glw::GLfloat, glw::GLubyte> configurationTexture2DRGBA32FLinear(
		4, 4, GL_TEXTURE_2D, GL_RGBA32F, GL_RGBA8, GL_LINEAR, GL_RGBA, GL_RGBA, 256, 256, 1, 0.0f, 1.0f, 0, 255,
		GL_FLOAT, GL_UNSIGNED_BYTE);

	addChild(new TextureBorderClampSamplingTexture<glw::GLfloat, glw::GLubyte>(
		m_context, m_extParams, "Texture2DRGBA32FLinear", "Test 7", configurationTexture2DRGBA32FLinear));

	/* GL_RGBA8 */
	TestConfiguration<glw::GLubyte, glw::GLubyte> configurationTexture2DRGBA8Linear(
		4, 4, GL_TEXTURE_2D, GL_RGBA8, GL_RGBA8, GL_LINEAR, GL_RGBA, GL_RGBA, 256, 256, 1, 0, 255, 0, 255,
		GL_UNSIGNED_BYTE, GL_UNSIGNED_BYTE);

	addChild(new TextureBorderClampSamplingTexture<glw::GLubyte, glw::GLubyte>(
		m_context, m_extParams, "Texture2DRGBA8Linear", "Test 7", configurationTexture2DRGBA8Linear));

	/* GL_DEPTH_COMPONENT32F */
	TestConfiguration<glw::GLfloat, glw::GLubyte> configurationTexture2DDC32FLinear(
		1, 1, GL_TEXTURE_2D, GL_DEPTH_COMPONENT32F, GL_R8, GL_LINEAR, GL_DEPTH_COMPONENT, GL_RED, 256, 256, 1, 0, 255,
		0, 255, GL_FLOAT, GL_UNSIGNED_BYTE);

	addChild(new TextureBorderClampSamplingTexture<glw::GLfloat, glw::GLubyte>(
		m_context, m_extParams, "Texture2DDC32FLinear", "Test 7", configurationTexture2DDC32FLinear));

	/* GL_DEPTH_COMPONENT16 */
	TestConfiguration<glw::GLushort, glw::GLubyte> configurationTexture2DDC16Linear(
		1, 1, GL_TEXTURE_2D, GL_DEPTH_COMPONENT16, GL_R8, GL_LINEAR, GL_DEPTH_COMPONENT, GL_RED, 256, 256, 1, 0, 255, 0,
		255, GL_UNSIGNED_SHORT, GL_UNSIGNED_BYTE);

	addChild(new TextureBorderClampSamplingTexture<glw::GLushort, glw::GLubyte>(
		m_context, m_extParams, "Texture2DDC16Linear", "Test 7", configurationTexture2DDC16Linear));

	/* GL_COMPRESSED_RGBA8_ETC2_EAC */
	TestConfiguration<glw::GLfloat, glw::GLubyte> configurationTexture2DCompressedLinear(
		4, 4, GL_TEXTURE_2D, GL_COMPRESSED_RGBA8_ETC2_EAC, GL_RGBA8, GL_LINEAR, GL_RGBA, GL_RGBA, 64, 64, 1, 0, 1, 0,
		255, GL_FLOAT, GL_UNSIGNED_BYTE);

	addChild(new TextureBorderClampSamplingTexture<glw::GLfloat, glw::GLubyte>(
		m_context, m_extParams, "Texture2DCompressedLinear", "Test 7", configurationTexture2DCompressedLinear));

	/* Target GL_TEXTURE_2D_ARRAY */

	/* GL_RGBA32F */
	TestConfiguration<glw::GLfloat, glw::GLubyte> configurationTexture2DArrayRGBA32FLinear(
		4, 4, GL_TEXTURE_2D_ARRAY, GL_RGBA32F, GL_RGBA8, GL_LINEAR, GL_RGBA, GL_RGBA, 256, 256, 6, 0.0f, 1.0f, 0, 255,
		GL_FLOAT, GL_UNSIGNED_BYTE);

	addChild(new TextureBorderClampSamplingTexture<glw::GLfloat, glw::GLubyte>(
		m_context, m_extParams, "Texture2DArrayRGBA32FLinear", "Test 7", configurationTexture2DArrayRGBA32FLinear));

	/* GL_RGBA8 */
	TestConfiguration<glw::GLubyte, glw::GLubyte> configurationTexture2DArrayRGBA8Linear(
		4, 4, GL_TEXTURE_2D_ARRAY, GL_RGBA8, GL_RGBA8, GL_LINEAR, GL_RGBA, GL_RGBA, 256, 256, 6, 0, 255, 0, 255,
		GL_UNSIGNED_BYTE, GL_UNSIGNED_BYTE);

	addChild(new TextureBorderClampSamplingTexture<glw::GLubyte, glw::GLubyte>(
		m_context, m_extParams, "Texture2DArrayRGBA8Linear", "Test 7", configurationTexture2DArrayRGBA8Linear));

	/* GL_COMPRESSED_RGBA8_ETC2_EAC */
	TestConfiguration<glw::GLfloat, glw::GLubyte> configurationTexture2DArrayCompressedLinear(
		4, 4, GL_TEXTURE_2D_ARRAY, GL_COMPRESSED_RGBA8_ETC2_EAC, GL_RGBA8, GL_LINEAR, GL_RGBA, GL_RGBA, 64, 64, 6, 0, 1,
		0, 255, GL_FLOAT, GL_UNSIGNED_BYTE);

	addChild(new TextureBorderClampSamplingTexture<glw::GLfloat, glw::GLubyte>(
		m_context, m_extParams, "Texture2DArrayCompressedLinear", "Test 7",
		configurationTexture2DArrayCompressedLinear));

	/* Target GL_TEXTURE_3D*/

	/* GL_RGBA32F */
	TestConfiguration<glw::GLfloat, glw::GLubyte> configurationTexture3DRGBA32FLinear(
		4, 4, GL_TEXTURE_3D, GL_RGBA32F, GL_RGBA8, GL_LINEAR, GL_RGBA, GL_RGBA, 256, 256, 6, 0.0f, 1.0f, 0, 255,
		GL_FLOAT, GL_UNSIGNED_BYTE);

	addChild(new TextureBorderClampSamplingTexture<glw::GLfloat, glw::GLubyte>(
		m_context, m_extParams, "Texture3DRGBA32FLinear", "Test 7", configurationTexture3DRGBA32FLinear));

	/* GL_RGBA8 */
	TestConfiguration<glw::GLubyte, glw::GLubyte> configurationTexture3DRGBA8Linear(
		4, 4, GL_TEXTURE_3D, GL_RGBA8, GL_RGBA8, GL_LINEAR, GL_RGBA, GL_RGBA, 256, 256, 6, 0, 255, 0, 255,
		GL_UNSIGNED_BYTE, GL_UNSIGNED_BYTE);

	addChild(new TextureBorderClampSamplingTexture<glw::GLubyte, glw::GLubyte>(
		m_context, m_extParams, "Texture3DRGBA8Linear", "Test 7", configurationTexture3DRGBA8Linear));
}